

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O2

void g_io_setup(void)

{
  _class *p_Var1;
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar2 = gensym("inlet");
  uVar4 = (ulong)uVar3 << 0x20;
  vinlet_class = class_new(ptVar2,vinlet_new,vinlet_free,0xc0,8,A_DEFSYM,uVar4);
  ptVar2 = gensym("inlet~");
  class_addcreator(vinlet_newsig,ptVar2,A_GIMME,0);
  class_addbang(vinlet_class,vinlet_bang);
  class_addpointer(vinlet_class,vinlet_pointer);
  class_doaddfloat(vinlet_class,vinlet_float);
  class_addsymbol(vinlet_class,vinlet_symbol);
  class_addlist(vinlet_class,vinlet_list);
  class_addanything(vinlet_class,vinlet_anything);
  p_Var1 = vinlet_class;
  ptVar2 = gensym("fwd");
  class_addmethod(p_Var1,vinlet_fwd,ptVar2,A_GIMME,0);
  p_Var1 = vinlet_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,vinlet_dsp,ptVar2,A_CANT,0);
  p_Var1 = vinlet_class;
  ptVar2 = gensym("inlet-outlet");
  class_sethelpsymbol(p_Var1,ptVar2);
  ptVar2 = gensym("outlet");
  voutlet_class =
       class_new(ptVar2,voutlet_new,voutlet_free,0xc0,8,A_DEFSYM,uVar4 & 0xffffffff00000000);
  ptVar2 = gensym("outlet~");
  class_addcreator(voutlet_newsig,ptVar2,A_DEFSYM,0);
  class_addbang(voutlet_class,voutlet_bang);
  class_addpointer(voutlet_class,voutlet_pointer);
  class_doaddfloat(voutlet_class,voutlet_float);
  class_addsymbol(voutlet_class,voutlet_symbol);
  class_addlist(voutlet_class,voutlet_list);
  class_addanything(voutlet_class,voutlet_anything);
  p_Var1 = voutlet_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,voutlet_dsp,ptVar2,A_CANT,0);
  p_Var1 = voutlet_class;
  ptVar2 = gensym("inlet-outlet");
  class_sethelpsymbol(p_Var1,ptVar2);
  return;
}

Assistant:

static void vinlet_setup(void)
{
    vinlet_class = class_new(gensym("inlet"), (t_newmethod)vinlet_new,
        (t_method)vinlet_free, sizeof(t_vinlet), CLASS_NOINLET, A_DEFSYM, 0);
    class_addcreator((t_newmethod)vinlet_newsig, gensym("inlet~"), A_GIMME, 0);
    class_addbang(vinlet_class, vinlet_bang);
    class_addpointer(vinlet_class, vinlet_pointer);
    class_addfloat(vinlet_class, vinlet_float);
    class_addsymbol(vinlet_class, vinlet_symbol);
    class_addlist(vinlet_class, vinlet_list);
    class_addanything(vinlet_class, vinlet_anything);
    class_addmethod(vinlet_class,(t_method)vinlet_fwd,  gensym("fwd"),
        A_GIMME, 0);
    class_addmethod(vinlet_class, (t_method)vinlet_dsp,
        gensym("dsp"), A_CANT, 0);
    class_sethelpsymbol(vinlet_class, gensym("inlet-outlet"));
}